

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Config * __thiscall Catch::Session::config(Session *this)

{
  Config *this_00;
  
  if ((this->m_config).m_p == (Config *)0x0) {
    this_00 = (Config *)operator_new(0x208);
    Config::Config(this_00,&this->m_configData);
    Ptr<Catch::Config>::operator=(&this->m_config,this_00);
  }
  return (this->m_config).m_p;
}

Assistant:

Config& config() {
            if( !m_config )
                m_config = new Config( m_configData );
            return *m_config;
        }